

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QPartialOrdering numericCompare(Private *d1,Private *d2)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  CompareUnderlyingType CVar4;
  ulong *puVar5;
  uint *puVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  optional<long_long> oVar17;
  optional<long_long> oVar18;
  optional<double> oVar19;
  optional<double> oVar20;
  _Storage<double,_true> local_50;
  undefined1 *local_48;
  _Storage<double,_true> local_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = *(ulong *)&d1->field_0x18 & 0xfffffffffffffffc;
  uVar10 = *(ulong *)&d2->field_0x18 & 0xfffffffffffffffc;
  uVar9 = *(uint *)(uVar8 + 0xc);
  uVar3 = *(uint *)(uVar10 + 0xc);
  bVar13 = 1;
  if (((uVar9 != 1) || (uVar3 != 10)) && ((uVar9 != 10 || (uVar3 != 1)))) {
    if (((uVar9 < 0x40) && ((0x8000004000000040U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) ||
       ((uVar3 < 0x40 && ((0x8000004000000040U >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      oVar19 = anon_unknown.dwarf_89ecae::qConvertToRealNumber(d1);
      local_40 = oVar19.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_38 = (undefined1 *)
                 CONCAT71(local_38._1_7_,
                          oVar19.super__Optional_base<double,_true,_true>._M_payload.
                          super__Optional_payload_base<double>._M_engaged);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      oVar20 = anon_unknown.dwarf_89ecae::qConvertToRealNumber(d2);
      local_50 = oVar20.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_48 = (undefined1 *)
                 CONCAT71(local_48._1_7_,
                          oVar20.super__Optional_base<double,_true,_true>._M_payload.
                          super__Optional_payload_base<double>._M_engaged);
      CVar4 = -0x7f;
      if ((((undefined1  [16])
            oVar19.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
         && (((undefined1  [16])
              oVar20.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0
            )) {
        pdVar7 = std::_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_>::_M_get
                           ((_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_> *
                            )&local_40);
        dVar1 = *pdVar7;
        pdVar7 = std::_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_>::_M_get
                           ((_Optional_base_impl<double,_std::_Optional_base<double,_true,_true>_> *
                            )&local_50);
        dVar2 = *pdVar7;
        CVar4 = -1;
        if (dVar2 <= dVar1) {
          CVar4 = '\x01';
          if (((dVar1 <= dVar2) && (CVar4 = -0x7f, dVar1 == dVar2)) && (!NAN(dVar1) && !NAN(dVar2)))
          {
            CVar4 = '\0';
          }
        }
      }
      goto LAB_002a4a9f;
    }
    bVar11 = (byte)(0x200000800000028 >> ((byte)uVar9 & 0x3f)) & uVar9 < 0x3a;
    bVar13 = 5;
    if ((((bVar11 != 1) || (*(uint *)(uVar8 + 4) < 5)) &&
        ((bVar12 = uVar3 < 0x3a & (byte)(0x200000800000028 >> ((byte)uVar3 & 0x3f)), bVar12 == 0 ||
         (*(uint *)(uVar10 + 4) < 5)))) &&
       ((bVar13 = 4, *(uint *)(uVar8 + 4) < 5 && (*(uint *)(uVar10 + 4) < 5)))) {
      bVar13 = bVar11 | bVar12 | 2;
    }
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  oVar17 = anon_unknown.dwarf_89ecae::qConvertToNumber(d1,bVar13 == 1);
  local_40 = oVar17.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload;
  local_38 = (undefined1 *)
             CONCAT71(local_38._1_7_,
                      oVar17.super__Optional_base<long_long,_true,_true>._M_payload.
                      super__Optional_payload_base<long_long>._M_engaged);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  oVar18 = anon_unknown.dwarf_89ecae::qConvertToNumber(d2,bVar13 == 1);
  local_50 = oVar18.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload;
  local_48 = (undefined1 *)
             CONCAT71(local_48._1_7_,
                      oVar18.super__Optional_base<long_long,_true,_true>._M_payload.
                      super__Optional_payload_base<long_long>._M_engaged);
  CVar4 = -0x7f;
  if ((((undefined1  [16])
        oVar17.super__Optional_base<long_long,_true,_true>._M_payload.
        super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
     || (((undefined1  [16])
          oVar18.super__Optional_base<long_long,_true,_true>._M_payload.
          super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
     ) goto LAB_002a4a9f;
  puVar5 = (ulong *)std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                    ::_M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                              *)&local_40);
  uVar8 = *puVar5;
  if (bVar13 == 5) {
    puVar5 = (ulong *)std::
                      _Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
                      _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                              *)&local_50);
    bVar14 = uVar8 < *puVar5;
    bVar15 = uVar8 == *puVar5;
LAB_002a4a7e:
    CVar4 = -1;
    if (!bVar14) {
      CVar4 = !bVar14 && !bVar15;
    }
  }
  else {
    if (bVar13 == 4) {
      puVar5 = (ulong *)std::
                        _Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                        ::_M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                                  *)&local_50);
      uVar10 = *puVar5;
      bVar16 = SBORROW8(uVar8,uVar10);
      bVar15 = (long)(uVar8 - uVar10) < 0;
      bVar14 = uVar8 == uVar10;
    }
    else {
      uVar9 = (uint)uVar8;
      if (bVar13 == 3) {
        puVar6 = (uint *)std::
                         _Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                         ::_M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                                   *)&local_50);
        bVar14 = uVar9 < *puVar6;
        bVar15 = uVar9 == *puVar6;
        goto LAB_002a4a7e;
      }
      puVar6 = (uint *)std::
                       _Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
                       _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>
                               *)&local_50);
      uVar3 = *puVar6;
      bVar16 = SBORROW4(uVar9,uVar3);
      bVar15 = (int)(uVar9 - uVar3) < 0;
      bVar14 = uVar9 == uVar3;
    }
    CVar4 = -1;
    if (bVar16 == bVar15) {
      CVar4 = !bVar14 && bVar16 == bVar15;
    }
  }
LAB_002a4a9f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QPartialOrdering)CVar4;
}

Assistant:

static QPartialOrdering numericCompare(const QVariant::Private *d1, const QVariant::Private *d2)
{
    uint promotedType = numericTypePromotion(d1->typeInterface(), d2->typeInterface());
    if (promotedType != QMetaType::QReal)
        return integralCompare(promotedType, d1, d2);

    // floating point comparison
    const auto r1 = qConvertToRealNumber(d1);
    const auto r2 = qConvertToRealNumber(d2);
    if (!r1 || !r2)
        return QPartialOrdering::Unordered;

    return Qt::compareThreeWay(*r1, *r2);
}